

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O0

string * __thiscall
soul::Program::ProgramImpl::getFunctionNameWithQualificationIfNeeded_abi_cxx11_
          (string *__return_storage_ptr__,ProgramImpl *this,Module *context,Function *f)

{
  bool bVar1;
  Module *pMVar2;
  string *psVar3;
  pool_ptr<soul::Module> local_38;
  pool_ptr<soul::Module> local_30;
  pool_ptr<soul::Module> m;
  Function *f_local;
  Module *context_local;
  ProgramImpl *this_local;
  
  m.object = (Module *)f;
  findModuleContainingFunction((ProgramImpl *)&stack0xffffffffffffffd0,(Function *)this);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&stack0xffffffffffffffd0);
  if (bVar1) {
    local_38.object = local_30.object;
    bVar1 = soul::operator==(&local_38,context);
    pool_ptr<soul::Module>::~pool_ptr(&local_38);
    if (bVar1) {
      psVar3 = Identifier::toString_abi_cxx11_((Identifier *)&(m.object)->fullName);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
      bVar1 = true;
    }
    else {
      pMVar2 = pool_ptr<soul::Module>::operator->(&stack0xffffffffffffffd0);
      psVar3 = Identifier::operator_cast_to_string_((Identifier *)&(m.object)->fullName);
      TokenisedPathString::join(__return_storage_ptr__,&pMVar2->fullName,psVar3);
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  pool_ptr<soul::Module>::~pool_ptr(&stack0xffffffffffffffd0);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("getFunctionNameWithQualificationIfNeeded",0xd4);
}

Assistant:

std::string getFunctionNameWithQualificationIfNeeded (const Module& context, const heart::Function& f) const
    {
        if (auto m = findModuleContainingFunction (f))
        {
            if (m == std::addressof (context))
                return f.name.toString();

            return TokenisedPathString::join (m->fullName, f.name);
        }

        SOUL_ASSERT_FALSE;
        return f.name;
    }